

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# galloping_upper_bound.hpp
# Opt level: O2

int * burst::galloping_upper_bound<std::initializer_list<int>const&,int,std::less<void>>
                (long *range,undefined8 value)

{
  int *piVar1;
  
  piVar1 = detail::
           galloping_search<int_const*,int,burst::not_fn_t<burst::invert_t<std::less<void>>>>
                     (*range,*range + range[1] * 4,value);
  return piVar1;
}

Assistant:

auto galloping_upper_bound (RandomAccessRange && range, const Value & value, Compare compare)
    {
        using std::begin;
        using std::end;
        return
            galloping_upper_bound
            (
                begin(std::forward<RandomAccessRange>(range)),
                end(std::forward<RandomAccessRange>(range)),
                value,
                std::move(compare)
            );
    }